

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_callback.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  callable<void_()> *tmp;
  ostream *poVar2;
  runtime_error *prVar3;
  callback<void_()> c;
  callback<void_()> c2;
  callback<int_()> fcnt1;
  callback<void_(int)> fvi;
  callback<void_()> f;
  int x;
  callback<int_()> fcnt2;
  callback<int_()> fi;
  ostringstream oss;
  string local_220 [40];
  callback<void_(int)> local_1f8;
  callback<void_()> local_1f0 [5];
  callback<int_()> local_1c8;
  ostringstream local_1c0 [408];
  
  fooid_called = false;
  fooi_called = false;
  foov_called = false;
  booster::callback<void()>::callback<void(*)()>((callback<void()> *)local_1f0,foov);
  booster::callback<void_()>::operator()(local_1f0);
  if (foov_called == false) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
               ,0x74);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x4a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," foov_called",0xc);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_220);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::callback<void()>::operator=((callback<void()> *)local_1f0,fooi);
  booster::callback<void_()>::operator()(local_1f0);
  if (fooi_called == false) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
               ,0x74);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x4d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," fooi_called",0xc);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_220);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::callback<int()>::callback<int(*)()>((callback<int()> *)&local_1c8,fooi);
  iVar1 = booster::callback<int_()>::operator()(&local_1c8);
  if (iVar1 != 10) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
               ,0x74);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x4f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," fi()==10",9);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_220);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_1c8.call_ptr.p_ == (callable<int_()> *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
               ,0x74);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,0x50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," fi",3);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_220);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1f8.call_ptr.p_ = (pointer_type)(callable<void_(int)> *)0x0;
  booster::callback<void_(int)>::operator()(&local_1f8,10);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"Not throws!");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	using booster::callback;
	try {
		reset();
		callback<void()> f=foov;
		f();
		TEST(foov_called);
		f=fooi;
		f();
		TEST(fooi_called);
		callback<int()> fi=fooi;
		TEST(fi()==10);
		TEST(fi);
		callback<void(int)> fvi;
		TEST(!fvi);
		try {
			fvi(10);
			throw std::runtime_error("Not throws!");
		}
		catch(booster::bad_callback_call const &e) {}
		fvi=fooid;
		TEST(fvi);
		fvi(10);
		TEST(fooid_called);
		int x=2;
		TEST(callback<int(int&)>(fooii)(x)==2);
		TEST(x==3);

		callback<int()> fcnt1=call_counter();
		callback<int()> fcnt2=fcnt1;
		TEST(fcnt1()==1);
		TEST(fcnt1()==2);
		TEST(fcnt2()==3);
		TEST(fcnt2()==4);

		{
			// move copy
			foov_called = false;
			callback<void()> c(foov);
			callback<void()> c2(std::move(c));
			TEST(c.empty());
			TEST(!c2.empty());
			c2();
			TEST(foov_called);
			foov_called=false;
		}
		{
			// move assignment
			foov_called = false;
			callback<void()> c(foov);
			callback<void()> c2(reset);
			TEST(!c.empty());
			TEST(!c2.empty());
			c2 = std::move(c);
			TEST(c.empty());
			TEST(!foov_called);
			c2();
			TEST(foov_called);
			foov_called=false;
		}
		
		{
			std::unique_ptr<mycall> mc(new mycall());
			callback<void()> f(std::move(mc));
			f();
			TEST(mycall_called); mycall_called=false;
		}
		{
			booster::intrusive_ptr<mycall> mc(new mycall());
			callback<void()> f(mc);
			f();
			TEST(mycall_called); mycall_called=false;
		}
		{
			std::unique_ptr<mycall> mc(new mycall());
			callback<void()> f;
			f=std::move(mc);
			f();
			TEST(mycall_called); mycall_called=false;
		}
		{
			booster::intrusive_ptr<mycall> mc(new mycall());
			callback<void()> f;
			f=mc;
			f();
			TEST(mycall_called); mycall_called=false;
		}
		{
			std::unique_ptr<myicall> mc(new myicall());
			callback<void(int)> f(std::move(mc));
			f(2);
			TEST(mycall_called); mycall_called=false;
		}
		{
			booster::intrusive_ptr<myicall> mc(new myicall());
			callback<void(int)> f(mc);
			f(2);
			TEST(mycall_called); mycall_called=false;
		}
		{
			std::unique_ptr<myicall> mc(new myicall());
			callback<void(int)> f;
			f=std::move(mc);
			f(2);
			TEST(mycall_called); mycall_called=false;
		}
		{
			booster::intrusive_ptr<myicall> mc(new myicall());
			callback<void(int)> f;
			f=mc;
			f(2);
			TEST(mycall_called); mycall_called=false;
		}


	}
	catch(std::exception const &e)
	{
		std::cout << "Fail"<< e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}